

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

HTMLElement * __thiscall
soul::HTMLGenerator::createModuleSection(HTMLGenerator *this,HTMLElement *parent,string_view name)

{
  string_view text;
  HTMLElement *pHVar1;
  allocator<char> local_61;
  string local_60;
  string_view local_40;
  HTMLElement *local_30;
  HTMLElement *list;
  HTMLElement *parent_local;
  HTMLGenerator *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (HTMLGenerator *)name._M_len;
  list = parent;
  parent_local = (HTMLElement *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"module_section");
  pHVar1 = choc::html::HTMLElement::addDiv(parent,local_40);
  local_30 = pHVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"h3",&local_61);
  pHVar1 = choc::html::HTMLElement::addChild(pHVar1,&local_60);
  text._M_str = (char *)name_local._M_len;
  text._M_len = (size_t)this_local;
  choc::html::HTMLElement::addContent(pHVar1,text);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return local_30;
}

Assistant:

choc::html::HTMLElement& createModuleSection (choc::html::HTMLElement& parent, std::string_view name)
    {
        auto& list = parent.addDiv ("module_section");
        list.addChild ("h3").addContent (name);
        return list;
    }